

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-export.cc
# Opt level: O3

bool tinyusdz::tydra::export_to_obj
               (RenderScene *scene,int mesh_id,string *obj_str,string *mtl_str,string *warn,
               string *err)

{
  size_type *psVar1;
  _Base_ptr *pp_Var2;
  _Base_ptr *pp_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
  *this;
  VertexVariability VVar5;
  uint uVar6;
  _Alloc_hider _Var7;
  pointer puVar8;
  pointer pRVar9;
  pointer pUVar10;
  pointer pTVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  ostream *poVar16;
  const_iterator cVar17;
  _Node_iterator_base<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_false> _Var18
  ;
  size_t sVar19;
  _Base_ptr *pp_Var20;
  mapped_type *pmVar21;
  _Base_ptr p_Var22;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar23;
  long *plVar24;
  uint uVar25;
  ulong uVar26;
  _Base_ptr p_Var27;
  __node_base_ptr *pp_Var28;
  undefined7 uVar33;
  __node_base_ptr *pp_Var29;
  pointer pcVar30;
  __node_base_ptr *pp_Var31;
  __node_base_ptr *pp_Var32;
  undefined8 extraout_RDX;
  ulong uVar34;
  long lVar35;
  undefined8 uVar36;
  long lVar37;
  char *pcVar38;
  _Base_ptr p_Var39;
  string *psVar40;
  long lVar41;
  pointer puVar42;
  pointer puVar43;
  pointer pRVar44;
  ulong uVar45;
  float *pfVar46;
  _Hash_node_base *p_Var47;
  bool bVar48;
  bool bVar49;
  int iVar51;
  undefined1 auVar50 [16];
  int iVar52;
  int iVar55;
  undefined1 auVar54 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> face_ids_2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  subset_face_ids;
  int32_t texId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> face_ids;
  int64_t imageId;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  face_groups;
  ostringstream ss_e;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  stringstream ss;
  key_type local_490;
  string *local_470;
  undefined1 local_468 [32];
  float local_448;
  size_t local_440;
  __node_base_ptr p_Stack_438;
  undefined1 local_42c [4];
  string local_428;
  undefined1 local_400 [8];
  _Base_ptr local_3f8;
  undefined1 local_3e9;
  undefined8 local_3e8;
  pointer local_3e0;
  _Base_ptr local_3d8;
  _Base_ptr local_3d0;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined4 local_3bc;
  ulong local_3b8;
  undefined1 local_3b0 [32];
  float local_390;
  size_t local_388;
  __node_base_ptr p_Stack_380;
  undefined1 local_374 [4];
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_370;
  undefined1 local_368 [16];
  pointer local_358;
  ios_base local_300 [264];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  string *local_1e0;
  string *local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1c8;
  ulong local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  undefined1 auVar53 [16];
  
  uVar34 = (ulong)(uint)mesh_id;
  local_374 = (undefined1  [4])mesh_id;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (mesh_id < 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_370,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
               ,0x5a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"export_to_obj",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"():",3);
    poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_370,0x26);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    pcVar38 = "Invalid mesh_id";
    lVar37 = 0xf;
LAB_00313189:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,pcVar38,lVar37);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"\n",1);
LAB_003131a5:
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      plVar24 = (long *)::std::__cxx11::string::append(local_468);
      pp_Var29 = (__node_base_ptr *)(plVar24 + 2);
      if ((__node_base_ptr *)*plVar24 == pp_Var29) {
        local_3b0._16_8_ = *pp_Var29;
        local_3b0._24_8_ = plVar24[3];
        local_3b0._0_8_ = local_3b0 + 0x10;
      }
      else {
        local_3b0._16_8_ = *pp_Var29;
        local_3b0._0_8_ = (__node_base_ptr *)*plVar24;
      }
      local_3b0._8_8_ = plVar24[1];
      *plVar24 = (long)pp_Var29;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)err,local_3b0._0_8_);
      if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3b0._16_8_ + 1));
      }
      if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
LAB_00313259:
        operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
      }
    }
  }
  else {
    pRVar44 = (scene->meshes).
              super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar26 = ((long)(scene->meshes).
                    super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar44 >> 5) *
             -0x7063e7063e7063e7;
    local_470 = err;
    local_1d8 = obj_str;
    if (uVar34 <= uVar26 && uVar26 - uVar34 != 0) {
      local_3e0 = pRVar44 + uVar34;
      local_3e8 = scene;
      local_1e0 = mtl_str;
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"# exported from TinyUSDZ Tydra.\n",0x20);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"mtllib ",7);
      poVar16 = (ostream *)::std::ostream::operator<<(local_1a8,mesh_id);
      _Var7._M_p = pRVar44[uVar34].prim_name._M_dataplus._M_p;
      local_370 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)(local_368 + 8);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_370,_Var7._M_p,
                 _Var7._M_p + pRVar44[uVar34].prim_name._M_string_length);
      ::std::__cxx11::string::append((char *)&local_370);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,(char *)local_370,local_368._0_8_);
      if (local_370 !=
          (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           *)(local_368 + 8)) {
        operator_delete(local_370,local_368._8_8_ + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      pRVar44 = local_3e0;
      if (*(pointer *)
           ((long)&(local_3e0->points).
                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                   ._M_impl + 8) !=
          (local_3e0->points).
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar37 = 0;
        uVar34 = 0;
        do {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"v ",2);
          poVar16 = ::std::ostream::_M_insert<double>
                              ((double)*(float *)(*(long *)&(pRVar44->points).
                                                                                                                        
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data + lVar37));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          poVar16 = ::std::ostream::_M_insert<double>
                              ((double)*(float *)(*(long *)&(pRVar44->points).
                                                                                                                        
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data + 4 + lVar37));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          poVar16 = ::std::ostream::_M_insert<double>
                              ((double)*(float *)(*(long *)&(pRVar44->points).
                                                                                                                        
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data + 8 + lVar37));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          uVar34 = uVar34 + 1;
          lVar37 = lVar37 + 0xc;
        } while (uVar34 < (ulong)(((long)*(pointer *)
                                          ((long)&(pRVar44->points).
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl + 8) -
                                   *(long *)&(pRVar44->points).
                                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                             ._M_impl.super__Vector_impl_data >> 2) *
                                 -0x5555555555555555));
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"# ",2);
      poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," vertices\n",10);
      p_Var22 = *(_Base_ptr *)
                 &(pRVar44->points).
                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data;
      p_Var27 = *(_Base_ptr *)
                 ((long)&(pRVar44->points).
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl + 8);
      p_Var39 = (_Base_ptr)(long)(pRVar44->joint_and_weights).elementSize;
      local_3d0 = p_Var39;
      if (((long)*(pointer *)
                  ((long)&(pRVar44->joint_and_weights).jointWeights.
                          super__Vector_base<float,_std::allocator<float>_> + 8) -
           *(long *)&(pRVar44->joint_and_weights).jointWeights.
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data >> 2 ==
           (long)p_Var39 * -0x5555555555555555 * ((long)p_Var27 - (long)p_Var22 >> 2)) &&
         (p_Var27 != p_Var22)) {
        local_3b8 = (long)p_Var39 << 2;
        local_3f8 = (_Base_ptr)0x0;
        p_Var22 = (_Base_ptr)0x0;
        do {
          local_3d8 = p_Var22;
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"vw ",3);
          pRVar44 = local_3e0;
          if ((int)local_3d0 != 0) {
            lVar37 = 0;
            p_Var22 = local_3f8;
            do {
              bVar48 = lVar37 != 0;
              lVar37 = lVar37 + -1;
              if (bVar48) {
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
              }
              poVar16 = (ostream *)
                        ::std::ostream::operator<<
                                  (local_1a8,
                                   *(int *)((long)&p_Var22->_M_color +
                                           *(long *)&(pRVar44->joint_and_weights).jointIndices.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              ::std::ostream::_M_insert<double>
                        ((double)*(float *)((long)&p_Var22->_M_color +
                                           *(long *)&(pRVar44->joint_and_weights).jointWeights.
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data));
              p_Var22 = (_Base_ptr)&p_Var22->field_0x4;
            } while ((_Base_ptr)-lVar37 != p_Var39);
          }
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
          p_Var22 = (_Base_ptr)
                    ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &local_3d8->_M_color)->_M_impl).super__Vector_impl_data._M_start + 1);
          p_Var27 = (_Base_ptr)((long)&local_3f8->_M_color + local_3b8);
          local_3f8 = p_Var27;
        } while (p_Var22 < (_Base_ptr)
                           (((long)*(pointer *)
                                    ((long)&(pRVar44->points).
                                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                            ._M_impl + 8) -
                             *(long *)&(pRVar44->points).
                                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                       ._M_impl.super__Vector_impl_data >> 2) * -0x5555555555555555)
                );
      }
      pRVar44 = local_3e0;
      this = &local_3e0->texcoords;
      local_370 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)((ulong)local_370 & 0xffffffff00000000);
      cVar17 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&this->_M_h,(key_type_conflict1 *)&local_370);
      uVar34 = CONCAT71((int7)((ulong)p_Var27 >> 8),1);
      local_3c4 = (undefined4)uVar34;
      if (cVar17.
          super__Node_iterator_base<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_3b8 = local_3b8 & 0xffffffff00000000;
        _Var18._M_cur = (__node_type *)0x0;
LAB_00312fa8:
        local_3c0 = (undefined4)CONCAT71((int7)((ulong)_Var18._M_cur >> 8),1);
      }
      else {
        local_370 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     *)((ulong)local_370 & 0xffffffff00000000);
        _Var18._M_cur =
             (__node_type *)
             ::std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&this->_M_h,(key_type_conflict1 *)&local_370);
        err = local_470;
        if (_Var18._M_cur == (__node_type *)0x0) {
          ::std::__throw_out_of_range("_Map_base::at");
        }
        local_3b8 = CONCAT44(local_3b8._4_4_,
                             (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),
                                           *(int *)((long)_Var18._M_cur + 0x70) == 4));
        uVar25 = *(int *)((long)_Var18._M_cur + 0x70) - 3;
        uVar34 = (ulong)uVar25;
        if (1 < uVar25) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_370,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_370,"export_to_obj",0xd);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_370,0x52);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          pcVar38 = "Vertex variability must be either \'vertex\' or \'facevarying\' for texcoord0";
          lVar37 = 0x49;
          goto LAB_00313189;
        }
        if (*(int *)((long)_Var18._M_cur + 0x30) != 0x16) goto LAB_00312fa8;
        lVar37 = *(long *)((long)_Var18._M_cur + 0x40);
        sVar19 = VertexAttribute::vertex_count((VertexAttribute *)((long)_Var18._M_cur + 0x10));
        if (sVar19 == 0) {
          local_3c0 = 0;
        }
        else {
          uVar26 = 0;
          do {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"vt ",3);
            poVar16 = ::std::ostream::_M_insert<double>((double)*(float *)(lVar37 + uVar26 * 8));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
            poVar16 = ::std::ostream::_M_insert<double>((double)*(float *)(lVar37 + 4 + uVar26 * 8))
            ;
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
            uVar26 = uVar26 + 1;
            sVar19 = VertexAttribute::vertex_count((VertexAttribute *)((long)_Var18._M_cur + 0x10));
          } while (uVar26 < sVar19);
          local_3c0 = 0;
          pRVar44 = local_3e0;
        }
      }
      puVar8 = (pRVar44->normals).data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar8 == *(pointer *)
                     ((long)&(pRVar44->normals).data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8))
      {
        local_3bc = 0;
      }
      else {
        VVar5 = (pRVar44->normals).variability;
        uVar33 = (undefined7)(uVar34 >> 8);
        local_3c4 = (undefined4)CONCAT71(uVar33,1);
        local_3bc = (undefined4)CONCAT71(uVar33,1);
        if (VVar5 != FaceVarying) {
          if (VVar5 != Vertex) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_370,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_370,"export_to_obj",0xd);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"():",3);
            poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_370,100);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_370,
                       "Vertex variability must be either \'vertex\' or \'facevarying\' for texcoord0"
                       ,0x49);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"\n",1);
            err = local_470;
            goto LAB_003131a5;
          }
          local_3bc = 0;
        }
        if ((pRVar44->normals).format == Vec3) {
          sVar19 = VertexAttribute::vertex_count(&pRVar44->normals);
          if (sVar19 == 0) {
            local_3c4 = 0;
          }
          else {
            pfVar46 = (float *)(puVar8 + 8);
            uVar34 = 0;
            do {
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"vn ",3);
              poVar16 = ::std::ostream::_M_insert<double>((double)pfVar46[-2]);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              poVar16 = ::std::ostream::_M_insert<double>((double)pfVar46[-1]);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              poVar16 = ::std::ostream::_M_insert<double>((double)*pfVar46);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
              uVar34 = uVar34 + 1;
              sVar19 = VertexAttribute::vertex_count(&pRVar44->normals);
              pfVar46 = pfVar46 + 3;
            } while (uVar34 < sVar19);
            local_3c4 = 0;
            pRVar44 = local_3e0;
          }
        }
      }
      local_3b0._0_8_ = &p_Stack_380;
      local_3b0._8_8_ = 1;
      local_3b0._16_8_ = (__node_base_ptr)0x0;
      local_3b0._24_8_ = 0;
      local_390 = 1.0;
      local_388 = 0;
      p_Stack_380 = (__node_base_ptr)0x0;
      if (*(size_t *)((long)&(pRVar44->material_subsetMap)._M_t._M_impl + 0x28) == 0) {
        lVar37 = 200;
        if (*(pointer *)
             ((long)&(pRVar44->triangulatedFaceVertexCounts).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) ==
            (pRVar44->triangulatedFaceVertexCounts).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar37 = 0x98;
        }
        if (*(pointer *)
             ((long)&(pRVar44->triangulatedFaceVertexIndices).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) ==
            (pRVar44->triangulatedFaceVertexIndices).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar37 = 0x98;
        }
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_490,
                   *(long *)((long)&(pRVar44->prim_name)._M_string_length + lVar37) -
                   *(long *)((long)&(pRVar44->prim_name)._M_dataplus._M_p + lVar37) >> 2,
                   (allocator_type *)&local_370);
        auVar14 = _DAT_005ce320;
        auVar13 = _DAT_005ce310;
        auVar12 = _DAT_005ce300;
        if (local_490._M_dataplus._M_p != (pointer)local_490._M_string_length) {
          pcVar30 = (pointer)(local_490._M_string_length + (-4 - (long)local_490._M_dataplus._M_p));
          auVar54._8_4_ = (int)pcVar30;
          auVar54._0_8_ = pcVar30;
          auVar54._12_4_ = (int)((ulong)pcVar30 >> 0x20);
          auVar50._0_8_ = (ulong)pcVar30 >> 2;
          auVar50._8_8_ = auVar54._8_8_ >> 2;
          uVar34 = 0;
          auVar50 = auVar50 ^ _DAT_005ce310;
          do {
            iVar52 = (int)uVar34;
            auVar53._8_4_ = iVar52;
            auVar53._0_8_ = uVar34;
            auVar53._12_4_ = (int)(uVar34 >> 0x20);
            auVar54 = (auVar53 | auVar12) ^ auVar13;
            iVar51 = auVar50._4_4_;
            if ((bool)(~(auVar54._4_4_ == iVar51 && auVar50._0_4_ < auVar54._0_4_ ||
                        iVar51 < auVar54._4_4_) & 1)) {
              *(int *)(local_490._M_dataplus._M_p + uVar34 * 4) = iVar52;
            }
            if ((auVar54._12_4_ != auVar50._12_4_ || auVar54._8_4_ <= auVar50._8_4_) &&
                auVar54._12_4_ <= auVar50._12_4_) {
              *(int *)(local_490._M_dataplus._M_p + uVar34 * 4 + 4) = iVar52 + 1;
            }
            auVar54 = (auVar53 | auVar14) ^ auVar13;
            iVar55 = auVar54._4_4_;
            if (iVar55 <= iVar51 && (iVar55 != iVar51 || auVar54._0_4_ <= auVar50._0_4_)) {
              *(int *)(local_490._M_dataplus._M_p + uVar34 * 4 + 8) = iVar52 + 2;
              *(int *)(local_490._M_dataplus._M_p + uVar34 * 4 + 0xc) = iVar52 + 3;
            }
            uVar34 = uVar34 + 4;
          } while ((((ulong)pcVar30 >> 2) + 4 & 0xfffffffffffffffc) != uVar34);
        }
        local_370 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     *)CONCAT44(local_370._4_4_,pRVar44->material_id);
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_368,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_490);
        local_468._0_8_ = local_468 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"");
        pmVar21 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_3b0,(key_type *)local_468);
        pmVar21->first = (int)local_370;
        puVar42 = (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar43 = (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_368._0_8_;
        (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_368._8_8_;
        (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_358;
        local_368._0_8_ = (pointer)0x0;
        local_368._8_8_ = (pointer)0x0;
        local_358 = (pointer)0x0;
        if (puVar42 != (pointer)0x0) {
          operator_delete(puVar42,(long)puVar43 - (long)puVar42);
        }
        if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
          operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
        }
        if ((pointer)local_368._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_368._0_8_,(long)local_358 - local_368._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_490._M_dataplus._M_p,
                          local_490.field_2._M_allocated_capacity - (long)local_490._M_dataplus._M_p
                         );
        }
      }
      else {
        local_468._0_8_ = &p_Stack_438;
        local_468._8_8_ = 1;
        local_468._16_8_ = (__node_base_ptr)0x0;
        local_468._24_8_ = 0;
        local_448 = 1.0;
        local_440 = 0;
        p_Stack_438 = (__node_base_ptr)0x0;
        p_Var22 = *(_Base_ptr *)((long)&(pRVar44->material_subsetMap)._M_t._M_impl + 0x18);
        local_3d8 = (_Base_ptr)((long)&(pRVar44->material_subsetMap)._M_t._M_impl + 8);
        if (p_Var22 != local_3d8) {
          do {
            pp_Var2 = &p_Var22[6]._M_parent;
            pp_Var3 = &p_Var22[5]._M_left;
            pp_Var20 = pp_Var2;
            if (p_Var22[6]._M_left == p_Var22[6]._M_parent) {
              pp_Var20 = pp_Var3;
            }
            local_3f8 = p_Var22;
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_1f8,(long)pp_Var20[1] - (long)*pp_Var20 >> 2,
                       (allocator_type *)&local_370);
            pp_Var20 = pp_Var2;
            if (local_3f8[6]._M_left == local_3f8[6]._M_parent) {
              pp_Var20 = pp_Var3;
            }
            p_Var22 = *pp_Var20;
            if (pp_Var20[1] != p_Var22) {
              lVar37 = 0;
              uVar34 = 0;
              do {
                *(_Rb_tree_color *)
                 ((long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar37) =
                     (&p_Var22->_M_color)[uVar34];
                local_370 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                             *)local_468;
                ::std::
                _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                          ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_468,
                           (long)local_1f8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar37,
                           (ostringstream *)&local_370);
                uVar34 = uVar34 + 1;
                pp_Var20 = pp_Var2;
                if (local_3f8[6]._M_left == local_3f8[6]._M_parent) {
                  pp_Var20 = pp_Var3;
                }
                p_Var22 = *pp_Var20;
                lVar37 = lVar37 + 4;
              } while (uVar34 < (ulong)((long)pp_Var20[1] - (long)p_Var22 >> 2));
            }
            p_Var22 = local_3f8[1]._M_parent;
            if (p_Var22 == (_Base_ptr)0x0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_370,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_370,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_370,"export_to_obj",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"():",3);
              poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_370,0x7c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_370,"Empty material_subset name is not allowed.",0x2a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"\n",1);
              psVar40 = local_470;
              if (local_470 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar24 = (long *)::std::__cxx11::string::append(local_42c + 4);
                psVar1 = (size_type *)(plVar24 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar24 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_490.field_2._M_allocated_capacity = *psVar1;
                  local_490.field_2._8_8_ = plVar24[3];
                  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                }
                else {
                  local_490.field_2._M_allocated_capacity = *psVar1;
                  local_490._M_dataplus._M_p = (pointer)*plVar24;
                }
                local_490._M_string_length = plVar24[1];
                *plVar24 = (long)psVar1;
                plVar24[1] = 0;
                *(undefined1 *)(plVar24 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)psVar40,(ulong)local_490._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_490._M_dataplus._M_p != &local_490.field_2) {
                  operator_delete(local_490._M_dataplus._M_p,
                                  local_490.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_428._M_dataplus._M_p != &local_428.field_2) {
                  operator_delete(local_428._M_dataplus._M_p,
                                  local_428.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
              ::std::ios_base::~ios_base(local_300);
            }
            else {
              p_Var27 = local_3f8 + 1;
              local_370 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)CONCAT44(local_370._4_4_,*(undefined4 *)&local_3f8[5]._M_parent);
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_368,&local_1f8
                        );
              pmVar21 = ::std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_3b0,(key_type *)p_Var27);
              pmVar21->first = (int)local_370;
              puVar42 = (pmVar21->second).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar43 = (pmVar21->second).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_368._0_8_;
              (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_368._8_8_;
              (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = local_358;
              local_368._0_8_ = (pointer)0x0;
              local_368._8_8_ = (pointer)0x0;
              local_358 = (pointer)0x0;
              if ((puVar42 != (pointer)0x0) &&
                 (operator_delete(puVar42,(long)puVar43 - (long)puVar42),
                 (pointer)local_368._0_8_ != (pointer)0x0)) {
                operator_delete((void *)local_368._0_8_,(long)local_358 - local_368._0_8_);
              }
            }
            pRVar44 = local_3e0;
            if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1f8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_1f8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1f8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (p_Var22 == (_Base_ptr)0x0) {
              ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)local_468);
              bVar48 = false;
              goto LAB_00317655;
            }
            p_Var22 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_3f8);
          } while (p_Var22 != local_3d8);
        }
        local_428._M_dataplus._M_p = (pointer)0x0;
        local_428._M_string_length = 0;
        local_428.field_2._M_allocated_capacity = 0;
        psVar40 = *(string **)
                   &(pRVar44->triangulatedFaceVertexIndices).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data;
        warn = *(string **)
                ((long)&(pRVar44->triangulatedFaceVertexIndices).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8)
        ;
        puVar43 = *(pointer *)
                   ((long)&(pRVar44->triangulatedFaceVertexCounts).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                   8);
        puVar42 = (pRVar44->triangulatedFaceVertexCounts).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar37 = 0x98;
        if (puVar43 != puVar42) {
          lVar37 = 200;
        }
        if (warn == psVar40) {
          lVar37 = 0x98;
        }
        if (*(long *)((long)&(pRVar44->prim_name)._M_string_length + lVar37) !=
            *(long *)((long)&(pRVar44->prim_name)._M_dataplus._M_p + lVar37)) {
          uVar34 = 0;
          do {
            uVar25 = (uint)uVar34;
            uVar26 = (uVar34 & 0xffffffff) % (ulong)local_468._8_8_;
            if (*(long **)(local_468._0_8_ + uVar26 * 8) != (long *)0x0) {
              plVar24 = (long *)**(long **)(local_468._0_8_ + uVar26 * 8);
              uVar6 = *(uint *)(plVar24 + 1);
              do {
                if (uVar6 == uVar25) goto LAB_003137cb;
                plVar24 = (long *)*plVar24;
              } while ((plVar24 != (long *)0x0) &&
                      (uVar6 = *(uint *)(plVar24 + 1),
                      (ulong)uVar6 % (ulong)local_468._8_8_ == uVar26));
            }
            local_370 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                         *)CONCAT44(local_370._4_4_,uVar25);
            if (local_428._M_string_length == local_428.field_2._M_allocated_capacity) {
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_42c + 4),
                         (iterator)local_428._M_string_length,(uint *)&local_370);
              psVar40 = *(string **)
                         &(local_3e0->triangulatedFaceVertexIndices).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
            }
            else {
              *(uint *)local_428._M_string_length = uVar25;
              local_428._M_string_length = local_428._M_string_length + 4;
            }
            warn = *(string **)
                    ((long)&(local_3e0->triangulatedFaceVertexIndices).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    + 8);
            puVar42 = (local_3e0->triangulatedFaceVertexCounts).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar43 = *(pointer *)
                       ((long)&(local_3e0->triangulatedFaceVertexCounts).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl + 8);
LAB_003137cb:
            uVar34 = uVar34 + 1;
            lVar37 = 0x98;
            if (puVar43 != puVar42) {
              lVar37 = 200;
            }
            if (warn == psVar40) {
              lVar37 = 0x98;
            }
            pRVar44 = local_3e0;
          } while (uVar34 < (ulong)(*(long *)((long)&(local_3e0->prim_name)._M_string_length +
                                             lVar37) -
                                    *(long *)((long)&(local_3e0->prim_name)._M_dataplus._M_p +
                                             lVar37) >> 2));
        }
        local_370 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     *)CONCAT44(local_370._4_4_,pRVar44->material_id);
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_368,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_42c + 4));
        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"");
        pmVar21 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_3b0,&local_490);
        pmVar21->first = (int)local_370;
        puVar42 = (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar43 = (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_368._0_8_;
        (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_368._8_8_;
        (pmVar21->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_358;
        local_368._0_8_ = (pointer)0x0;
        local_368._8_8_ = (pointer)0x0;
        local_358 = (pointer)0x0;
        if (puVar42 != (pointer)0x0) {
          operator_delete(puVar42,(long)puVar43 - (long)puVar42);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p != &local_490.field_2) {
          operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_368._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_368._0_8_,(long)local_358 - local_368._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_428._M_dataplus._M_p,
                          local_428.field_2._M_allocated_capacity - (long)local_428._M_dataplus._M_p
                         );
        }
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_468);
      }
      lVar35 = 200;
      lVar37 = 0x98;
      if (*(pointer *)
           ((long)&(pRVar44->triangulatedFaceVertexCounts).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) !=
          (pRVar44->triangulatedFaceVertexCounts).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar37 = 200;
      }
      if (*(pointer *)
           ((long)&(pRVar44->triangulatedFaceVertexIndices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) ==
          (pRVar44->triangulatedFaceVertexIndices).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar37 = 0x98;
      }
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1f8,
                 *(long *)((long)&(pRVar44->prim_name)._M_string_length + lVar37) -
                 *(long *)((long)&(pRVar44->prim_name)._M_dataplus._M_p + lVar37) >> 2,
                 (allocator_type *)&local_370);
      puVar42 = (pRVar44->triangulatedFaceVertexIndices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&(pRVar44->triangulatedFaceVertexCounts).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) ==
          (pRVar44->triangulatedFaceVertexCounts).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar35 = 0x98;
      }
      puVar43 = *(pointer *)
                 ((long)&(pRVar44->triangulatedFaceVertexIndices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8
                 );
      if (puVar43 == puVar42) {
        lVar35 = 0x98;
      }
      if (*(long *)((long)&(pRVar44->prim_name)._M_string_length + lVar35) !=
          *(long *)((long)&(pRVar44->prim_name)._M_dataplus._M_p + lVar35)) {
        lVar37 = 0;
        psVar40 = (string *)0x0;
        do {
          *(long *)(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start + (long)psVar40 * 2) = lVar37;
          lVar35 = 200;
          if (*(pointer *)
               ((long)&(pRVar44->triangulatedFaceVertexCounts).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8)
              == (pRVar44->triangulatedFaceVertexCounts).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
            lVar35 = 0x98;
          }
          lVar41 = 0x98;
          if (puVar43 != puVar42) {
            lVar41 = lVar35;
          }
          lVar35 = *(long *)((long)&(pRVar44->prim_name)._M_dataplus._M_p + lVar41);
          lVar37 = lVar37 + (ulong)*(uint *)(lVar35 + (long)psVar40 * 4);
          psVar40 = (string *)((long)&(psVar40->_M_dataplus)._M_p + 1);
          warn = (string *)
                 (*(long *)((long)&(pRVar44->prim_name)._M_string_length + lVar41) - lVar35 >> 2);
        } while (psVar40 < warn);
      }
      if ((__node_base_ptr)local_3b0._16_8_ != (__node_base_ptr)0x0) {
        local_3e9 = (byte)local_3c0 | (byte)local_3c4;
        local_3f8 = (_Base_ptr)0x0;
        local_3d8 = (_Base_ptr)&pRVar44->triangulatedFaceVertexCounts;
        local_3d0 = (_Base_ptr)&pRVar44->usdFaceVertexCounts;
        local_1c8 = &pRVar44->usdFaceVertexIndices;
        local_1d0 = &pRVar44->triangulatedFaceVertexIndices;
        p_Var47 = (_Hash_node_base *)local_3b0._16_8_;
        do {
          if (p_Var47[2]._M_nxt != (_Hash_node_base *)0x0) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"g ",2);
            poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)p_Var47[1]._M_nxt,(long)p_Var47[2]._M_nxt);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          }
          lVar37 = (long)*(int *)&p_Var47[5]._M_nxt;
          if (-1 < lVar37) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"usemtl ",7);
            pRVar9 = (((vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                        *)(local_3e8 + 0xf8))->
                     super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,pRVar9[lVar37].name._M_dataplus._M_p,
                                 pRVar9[lVar37].name._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          }
          if (p_Var47[7]._M_nxt != p_Var47[6]._M_nxt) {
            uVar34 = 0;
            do {
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"f ",2);
              bVar48 = *(pointer *)
                        ((long)&(pRVar44->triangulatedFaceVertexIndices).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl + 8) !=
                       (pRVar44->triangulatedFaceVertexIndices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              bVar49 = *(pointer *)
                        ((long)&(pRVar44->triangulatedFaceVertexCounts).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl + 8) !=
                       (pRVar44->triangulatedFaceVertexCounts).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              warn = (string *)CONCAT71((int7)((ulong)warn >> 8),bVar49 && bVar48);
              p_Var22 = local_3d0;
              if (bVar49 && bVar48) {
                p_Var22 = local_3d8;
              }
              uVar26 = (ulong)*(uint *)((long)&(p_Var47[6]._M_nxt)->_M_nxt + uVar34 * 4);
              if (*(int *)(*(long *)p_Var22 + uVar26 * 4) != 0) {
                uVar45 = 0;
                local_1c0 = uVar34;
                do {
                  if (uVar45 != 0) {
                    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
                  }
                  poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                  if (local_3e9 == 0) {
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"/",1);
                    poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                    lVar37 = 1;
                    pcVar38 = "/";
                    uVar34 = local_1c0;
LAB_00313f0e:
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar38,lVar37);
LAB_00313f2c:
                    ::std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                  }
                  else {
                    if ((char)local_3c0 == '\0') {
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"/",1);
                      goto LAB_00313f2c;
                    }
                    if ((byte)local_3c4 == '\0') {
                      lVar37 = 2;
                      pcVar38 = "//";
                      goto LAB_00313f0e;
                    }
                  }
                  uVar45 = uVar45 + 1;
                  bVar48 = *(pointer *)
                            ((long)&(local_3e0->triangulatedFaceVertexIndices).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + 8) !=
                           (local_3e0->triangulatedFaceVertexIndices).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  bVar49 = *(pointer *)
                            ((long)&(local_3e0->triangulatedFaceVertexCounts).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + 8) !=
                           (local_3e0->triangulatedFaceVertexCounts).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  warn = (string *)CONCAT71((int7)((ulong)warn >> 8),bVar49 && bVar48);
                  p_Var22 = local_3d0;
                  if (bVar49 && bVar48) {
                    p_Var22 = local_3d8;
                  }
                  uVar26 = (ulong)*(uint *)((long)&(p_Var47[6]._M_nxt)->_M_nxt + uVar34 * 4);
                  pRVar44 = local_3e0;
                } while (uVar45 < *(uint *)(*(long *)p_Var22 + uVar26 * 4));
              }
              pvVar23 = local_1c8;
              if ((char)warn != '\0') {
                pvVar23 = local_1d0;
              }
              local_3f8 = (_Base_ptr)
                          ((long)&local_3f8->_M_color +
                          (ulong)*(uint *)(*(long *)&(pvVar23->
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data + uVar26 * 4));
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
              uVar34 = uVar34 + 1;
            } while (uVar34 < (ulong)((long)p_Var47[7]._M_nxt - (long)p_Var47[6]._M_nxt >> 2));
          }
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
          p_Var47 = p_Var47->_M_nxt;
        } while (p_Var47 != (_Hash_node_base *)0x0);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::operator=((string *)local_1d8,(string *)&local_370);
      if (local_370 !=
          (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           *)(local_368 + 8)) {
        operator_delete(local_370,local_368._8_8_ + 1);
      }
      local_370 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)(local_368 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"");
      ::std::__cxx11::stringbuf::str(local_1a0);
      if (local_370 !=
          (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           *)(local_368 + 8)) {
        operator_delete(local_370,local_368._8_8_ + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"# exported from TinyUSDZ Tydra.\n",0x20);
      if ((__node_base_ptr)local_3b0._16_8_ != (__node_base_ptr)0x0) {
        uVar36 = local_3e8;
        p_Var47 = (_Hash_node_base *)local_3b0._16_8_;
        do {
          uVar34 = (ulong)*(uint *)&p_Var47[5]._M_nxt;
          if (uVar34 != 0xffffffff) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"newmtl ",7);
            pRVar9 = (((RenderScene *)uVar36)->materials).
                     super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,pRVar9[uVar34].name._M_dataplus._M_p,
                                 pRVar9[uVar34].name._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
            pRVar9 = (((RenderScene *)uVar36)->materials).
                     super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar51 = pRVar9[uVar34].surfaceShader.diffuseColor.texture_id;
            if ((long)iVar51 < 0) {
              local_3d0 = (_Base_ptr)
                          (double)pRVar9[uVar34].surfaceShader.diffuseColor.value._M_elems[0];
              local_3d8 = (_Base_ptr)
                          (double)*(float *)((long)&pRVar9[uVar34].surfaceShader.diffuseColor.value
                                            + 4);
              local_3f8 = (_Base_ptr)
                          (double)*(float *)((long)&pRVar9[uVar34].surfaceShader.diffuseColor.value
                                            + 8);
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Kd ",3);
              poVar16 = ::std::ostream::_M_insert<double>((double)local_3d0);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              poVar16 = ::std::ostream::_M_insert<double>((double)local_3d8);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              poVar16 = ::std::ostream::_M_insert<double>((double)local_3f8);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
LAB_00314534:
              uVar36 = local_3e8;
              pRVar9 = (((vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                          *)(local_3e8 + 0xf8))->
                       super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (pRVar9[uVar34].surfaceShader.useSpecularWorkflow == true) {
                iVar51 = pRVar9[uVar34].surfaceShader.specularColor.texture_id;
                if (-1 < (long)iVar51) {
                  pUVar10 = (((vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                               *)(local_3e8 + 0x140))->
                            super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  local_42c = (undefined1  [4])iVar51;
                  if (iVar51 < (int)((ulong)((long)*(pointer *)(local_3e8 + 0x148) - (long)pUVar10)
                                    >> 3) * 0x2fa0be83) {
                    local_400 = (undefined1  [8])pUVar10[iVar51].texture_image_id;
                    if ((-1 < (long)local_400) &&
                       (pTVar11 = (((vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                     *)(local_3e8 + 0xe0))->
                                  super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                  )._M_impl.super__Vector_impl_data._M_start,
                       lVar37 = (long)*(pointer *)(local_3e8 + 0xe8) - (long)pTVar11 >> 4,
                       SBORROW8((long)local_400,lVar37 * -0x3333333333333333) !=
                       (long)((long)local_400 + lVar37 * 0x3333333333333333) < 0)) {
                      local_468._0_8_ = local_468 + 0x10;
                      _Var7._M_p = pTVar11[(long)local_400].asset_identifier._M_dataplus._M_p;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)local_468,_Var7._M_p,
                                 _Var7._M_p +
                                 pTVar11[(long)local_400].asset_identifier._M_string_length);
                      uVar26 = local_468._8_8_;
                      if (local_468._8_8_ == 0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_370,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_370,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_370,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_370,"export_to_obj",0xd);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_370,"():",3);
                        iVar51 = 0xfa;
                        goto LAB_00314905;
                      }
                      pcVar38 = "map_Ks ";
LAB_00314708:
                      uVar26 = local_468._8_8_;
                      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar38,7);
                      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                      goto LAB_00314a95;
                    }
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0xf5;
                    goto LAB_00316f7e;
                  }
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_370,"():",3);
                  iVar51 = 0xf0;
                  goto LAB_0031749b;
                }
                local_3f8 = (_Base_ptr)
                            CONCAT44(local_3f8._4_4_,
                                     *(float *)((long)&pRVar9[uVar34].surfaceShader.specularColor.
                                                       value + 8));
                local_3d0 = (_Base_ptr)
                            (double)pRVar9[uVar34].surfaceShader.specularColor.value._M_elems[0];
                local_3d8 = (_Base_ptr)
                            (double)*(float *)((long)&pRVar9[uVar34].surfaceShader.specularColor.
                                                      value + 4);
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Ks ",3);
                poVar16 = ::std::ostream::_M_insert<double>((double)local_3d0);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                poVar16 = ::std::ostream::_M_insert<double>((double)local_3d8);
                lVar37 = 1;
                pcVar38 = " ";
LAB_003147ed:
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar38,lVar37);
                poVar16 = ::std::ostream::_M_insert<double>((double)local_3f8._0_4_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
LAB_00314aba:
                uVar36 = local_3e8;
                pRVar9 = (((vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                            *)(local_3e8 + 0xf8))->
                         super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                iVar51 = pRVar9[uVar34].surfaceShader.roughness.texture_id;
                if ((long)iVar51 < 0) {
                  local_3f8 = (_Base_ptr)(double)pRVar9[uVar34].surfaceShader.roughness.value;
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Pr ",3);
                  poVar16 = ::std::ostream::_M_insert<double>((double)local_3f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                }
                else {
                  pUVar10 = (((vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                               *)(local_3e8 + 0x140))->
                            super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  local_42c = (undefined1  [4])iVar51;
                  if ((int)((ulong)((long)*(pointer *)(local_3e8 + 0x148) - (long)pUVar10) >> 3) *
                      0x2fa0be83 <= iVar51) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x11c;
                    goto LAB_0031749b;
                  }
                  local_400 = (undefined1  [8])pUVar10[iVar51].texture_image_id;
                  if (((long)local_400 < 0) ||
                     (pTVar11 = (((vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                   *)(local_3e8 + 0xe0))->
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                     lVar37 = (long)*(pointer *)(local_3e8 + 0xe8) - (long)pTVar11 >> 4,
                     SBORROW8((long)local_400,lVar37 * -0x3333333333333333) ==
                     (long)((long)local_400 + lVar37 * 0x3333333333333333) < 0)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x121;
                    goto LAB_00316f7e;
                  }
                  local_468._0_8_ = local_468 + 0x10;
                  _Var7._M_p = pTVar11[(long)local_400].asset_identifier._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_468,_Var7._M_p,
                             _Var7._M_p + pTVar11[(long)local_400].asset_identifier._M_string_length
                            );
                  uVar15 = local_468._8_8_;
                  if (local_468._8_8_ == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    poVar16 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)&local_370,0x126);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_42c + 4),"Filename for image id {} is empty.","");
                    fmt::format<long>(&local_490,(string *)(local_42c + 4),(long *)local_400);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_370,local_490._M_dataplus._M_p,
                                         local_490._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p,
                                      local_428.field_2._M_allocated_capacity + 1);
                    }
                    if (local_470 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar24 = (long *)::std::__cxx11::string::append(local_42c + 4);
                      psVar1 = (size_type *)(plVar24 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar24 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490.field_2._8_8_ = plVar24[3];
                        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                      }
                      else {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490._M_dataplus._M_p = (pointer)*plVar24;
                      }
                      local_490._M_string_length = plVar24[1];
                      *plVar24 = (long)psVar1;
                      plVar24[1] = 0;
                      *(undefined1 *)(plVar24 + 2) = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_490._M_dataplus._M_p != &local_490.field_2) {
                        operator_delete(local_490._M_dataplus._M_p,
                                        local_490.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p,
                                        local_428.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
                    ::std::ios_base::~ios_base(local_300);
                  }
                  else {
                    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Pr ",7);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                  }
                  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                  }
                  uVar36 = local_3e8;
                  if (uVar15 == 0) goto LAB_00317636;
                }
                pRVar9 = (((RenderScene *)uVar36)->materials).
                         super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar51 = pRVar9[uVar34].surfaceShader.emissiveColor.texture_id;
                if ((long)iVar51 < 0) {
                  local_3d0 = (_Base_ptr)
                              (double)pRVar9[uVar34].surfaceShader.emissiveColor.value._M_elems[0];
                  local_3d8 = (_Base_ptr)
                              (double)*(float *)((long)&pRVar9[uVar34].surfaceShader.emissiveColor.
                                                        value + 4);
                  local_3f8 = (_Base_ptr)
                              (double)*(float *)((long)&pRVar9[uVar34].surfaceShader.emissiveColor.
                                                        value + 8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Ke ",3);
                  poVar16 = ::std::ostream::_M_insert<double>((double)local_3d0);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                  poVar16 = ::std::ostream::_M_insert<double>((double)local_3d8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                  poVar16 = ::std::ostream::_M_insert<double>((double)local_3f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                }
                else {
                  pUVar10 = (((RenderScene *)uVar36)->textures).
                            super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_42c = (undefined1  [4])iVar51;
                  if ((int)((ulong)((long)(((RenderScene *)uVar36)->textures).
                                          super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar10
                                   ) >> 3) * 0x2fa0be83 <= iVar51) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x131;
                    goto LAB_0031749b;
                  }
                  local_400 = (undefined1  [8])pUVar10[iVar51].texture_image_id;
                  if (((long)local_400 < 0) ||
                     (pTVar11 = (((RenderScene *)uVar36)->images).
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                     lVar37 = (long)(((RenderScene *)uVar36)->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11 >> 4,
                     SBORROW8((long)local_400,lVar37 * -0x3333333333333333) ==
                     (long)((long)local_400 + lVar37 * 0x3333333333333333) < 0)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x136;
                    goto LAB_00316f7e;
                  }
                  local_468._0_8_ = local_468 + 0x10;
                  _Var7._M_p = pTVar11[(long)local_400].asset_identifier._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_468,_Var7._M_p,
                             _Var7._M_p + pTVar11[(long)local_400].asset_identifier._M_string_length
                            );
                  uVar36 = local_468._8_8_;
                  if (local_468._8_8_ == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    poVar16 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)&local_370,0x13b);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_42c + 4),"Filename for image id {} is empty.","");
                    fmt::format<long>(&local_490,(string *)(local_42c + 4),(long *)local_400);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_370,local_490._M_dataplus._M_p,
                                         local_490._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p,
                                      local_428.field_2._M_allocated_capacity + 1);
                    }
                    if (local_470 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar24 = (long *)::std::__cxx11::string::append(local_42c + 4);
                      psVar1 = (size_type *)(plVar24 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar24 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490.field_2._8_8_ = plVar24[3];
                        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                      }
                      else {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490._M_dataplus._M_p = (pointer)*plVar24;
                      }
                      local_490._M_string_length = plVar24[1];
                      *plVar24 = (long)psVar1;
                      plVar24[1] = 0;
                      *(undefined1 *)(plVar24 + 2) = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_490._M_dataplus._M_p != &local_490.field_2) {
                        operator_delete(local_490._M_dataplus._M_p,
                                        local_490.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p,
                                        local_428.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
                    ::std::ios_base::~ios_base(local_300);
                  }
                  else {
                    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Ke ",7);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                  }
                  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                  }
                  if (uVar36 == 0) goto LAB_00317636;
                }
                uVar36 = local_3e8;
                pRVar9 = (((vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                            *)(local_3e8 + 0xf8))->
                         super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                iVar51 = pRVar9[uVar34].surfaceShader.opacity.texture_id;
                if ((long)iVar51 < 0) {
                  local_3f8 = (_Base_ptr)(double)pRVar9[uVar34].surfaceShader.opacity.value;
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"d ",2);
                  poVar16 = ::std::ostream::_M_insert<double>((double)local_3f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                }
                else {
                  pUVar10 = (((vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                               *)(local_3e8 + 0x140))->
                            super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  local_42c = (undefined1  [4])iVar51;
                  if ((int)((ulong)((long)*(pointer *)(local_3e8 + 0x148) - (long)pUVar10) >> 3) *
                      0x2fa0be83 <= iVar51) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x147;
                    goto LAB_0031749b;
                  }
                  local_400 = (undefined1  [8])pUVar10[iVar51].texture_image_id;
                  if (((long)local_400 < 0) ||
                     (pTVar11 = (((vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                   *)(local_3e8 + 0xe0))->
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                     lVar37 = (long)*(pointer *)(local_3e8 + 0xe8) - (long)pTVar11 >> 4,
                     SBORROW8((long)local_400,lVar37 * -0x3333333333333333) ==
                     (long)((long)local_400 + lVar37 * 0x3333333333333333) < 0)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x14c;
                    goto LAB_00316f7e;
                  }
                  local_468._0_8_ = local_468 + 0x10;
                  _Var7._M_p = pTVar11[(long)local_400].asset_identifier._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_468,_Var7._M_p,
                             _Var7._M_p + pTVar11[(long)local_400].asset_identifier._M_string_length
                            );
                  uVar15 = local_468._8_8_;
                  if (local_468._8_8_ == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    poVar16 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)&local_370,0x151);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_42c + 4),"Filename for image id {} is empty.","");
                    fmt::format<long>(&local_490,(string *)(local_42c + 4),(long *)local_400);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_370,local_490._M_dataplus._M_p,
                                         local_490._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p,
                                      local_428.field_2._M_allocated_capacity + 1);
                    }
                    if (local_470 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar24 = (long *)::std::__cxx11::string::append(local_42c + 4);
                      psVar1 = (size_type *)(plVar24 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar24 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490.field_2._8_8_ = plVar24[3];
                        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                      }
                      else {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490._M_dataplus._M_p = (pointer)*plVar24;
                      }
                      local_490._M_string_length = plVar24[1];
                      *plVar24 = (long)psVar1;
                      plVar24[1] = 0;
                      *(undefined1 *)(plVar24 + 2) = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_490._M_dataplus._M_p != &local_490.field_2) {
                        operator_delete(local_490._M_dataplus._M_p,
                                        local_490.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p,
                                        local_428.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
                    ::std::ios_base::~ios_base(local_300);
                  }
                  else {
                    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_d ",6);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                  }
                  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                  }
                  uVar36 = local_3e8;
                  if (uVar15 == 0) goto LAB_00317636;
                }
                pRVar9 = (((RenderScene *)uVar36)->materials).
                         super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar51 = pRVar9[uVar34].surfaceShader.clearcoat.texture_id;
                if ((long)iVar51 < 0) {
                  local_3f8 = (_Base_ptr)(double)pRVar9[uVar34].surfaceShader.clearcoat.value;
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Pc ",3);
                  poVar16 = ::std::ostream::_M_insert<double>((double)local_3f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                }
                else {
                  pUVar10 = (((RenderScene *)uVar36)->textures).
                            super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_42c = (undefined1  [4])iVar51;
                  if ((int)((ulong)((long)(((RenderScene *)uVar36)->textures).
                                          super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar10
                                   ) >> 3) * 0x2fa0be83 <= iVar51) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x15d;
                    goto LAB_0031749b;
                  }
                  local_400 = (undefined1  [8])pUVar10[iVar51].texture_image_id;
                  if (((long)local_400 < 0) ||
                     (pTVar11 = (((RenderScene *)uVar36)->images).
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                     lVar37 = (long)(((RenderScene *)uVar36)->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11 >> 4,
                     SBORROW8((long)local_400,lVar37 * -0x3333333333333333) ==
                     (long)((long)local_400 + lVar37 * 0x3333333333333333) < 0)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x162;
                    goto LAB_00316f7e;
                  }
                  local_468._0_8_ = local_468 + 0x10;
                  _Var7._M_p = pTVar11[(long)local_400].asset_identifier._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_468,_Var7._M_p,
                             _Var7._M_p + pTVar11[(long)local_400].asset_identifier._M_string_length
                            );
                  uVar15 = local_468._8_8_;
                  if (local_468._8_8_ == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    poVar16 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)&local_370,0x167);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_42c + 4),"Filename for image id {} is empty.","");
                    fmt::format<long>(&local_490,(string *)(local_42c + 4),(long *)local_400);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_370,local_490._M_dataplus._M_p,
                                         local_490._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p,
                                      local_428.field_2._M_allocated_capacity + 1);
                    }
                    if (local_470 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar24 = (long *)::std::__cxx11::string::append(local_42c + 4);
                      psVar1 = (size_type *)(plVar24 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar24 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490.field_2._8_8_ = plVar24[3];
                        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                      }
                      else {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490._M_dataplus._M_p = (pointer)*plVar24;
                      }
                      local_490._M_string_length = plVar24[1];
                      *plVar24 = (long)psVar1;
                      plVar24[1] = 0;
                      *(undefined1 *)(plVar24 + 2) = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_490._M_dataplus._M_p != &local_490.field_2) {
                        operator_delete(local_490._M_dataplus._M_p,
                                        local_490.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p,
                                        local_428.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
                    ::std::ios_base::~ios_base(local_300);
                  }
                  else {
                    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Pc ",7);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                  }
                  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                  }
                  uVar36 = local_3e8;
                  if (uVar15 == 0) goto LAB_00317636;
                }
                pRVar9 = (((RenderScene *)uVar36)->materials).
                         super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar51 = pRVar9[uVar34].surfaceShader.clearcoatRoughness.texture_id;
                if ((long)iVar51 < 0) {
                  local_3f8 = (_Base_ptr)
                              (double)pRVar9[uVar34].surfaceShader.clearcoatRoughness.value;
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Pcr ",4);
                  poVar16 = ::std::ostream::_M_insert<double>((double)local_3f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                }
                else {
                  pUVar10 = (((RenderScene *)uVar36)->textures).
                            super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_42c = (undefined1  [4])iVar51;
                  if ((int)((ulong)((long)(((RenderScene *)uVar36)->textures).
                                          super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar10
                                   ) >> 3) * 0x2fa0be83 <= iVar51) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x172;
                    goto LAB_0031749b;
                  }
                  local_400 = (undefined1  [8])pUVar10[iVar51].texture_image_id;
                  if (((long)local_400 < 0) ||
                     (pTVar11 = (((RenderScene *)uVar36)->images).
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                     lVar37 = (long)(((RenderScene *)uVar36)->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11 >> 4,
                     SBORROW8((long)local_400,lVar37 * -0x3333333333333333) ==
                     (long)((long)local_400 + lVar37 * 0x3333333333333333) < 0)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x177;
                    goto LAB_00316f7e;
                  }
                  local_468._0_8_ = local_468 + 0x10;
                  _Var7._M_p = pTVar11[(long)local_400].asset_identifier._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_468,_Var7._M_p,
                             _Var7._M_p + pTVar11[(long)local_400].asset_identifier._M_string_length
                            );
                  uVar15 = local_468._8_8_;
                  if (local_468._8_8_ == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    poVar16 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)&local_370,0x17c);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_42c + 4),"Filename for image id {} is empty.","");
                    fmt::format<long>(&local_490,(string *)(local_42c + 4),(long *)local_400);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_370,local_490._M_dataplus._M_p,
                                         local_490._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p,
                                      local_428.field_2._M_allocated_capacity + 1);
                    }
                    if (local_470 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar24 = (long *)::std::__cxx11::string::append(local_42c + 4);
                      psVar1 = (size_type *)(plVar24 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar24 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490.field_2._8_8_ = plVar24[3];
                        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                      }
                      else {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490._M_dataplus._M_p = (pointer)*plVar24;
                      }
                      local_490._M_string_length = plVar24[1];
                      *plVar24 = (long)psVar1;
                      plVar24[1] = 0;
                      *(undefined1 *)(plVar24 + 2) = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_490._M_dataplus._M_p != &local_490.field_2) {
                        operator_delete(local_490._M_dataplus._M_p,
                                        local_490.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p,
                                        local_428.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
                    ::std::ios_base::~ios_base(local_300);
                  }
                  else {
                    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Pcr ",8);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                  }
                  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                  }
                  uVar36 = local_3e8;
                  if (uVar15 == 0) goto LAB_00317636;
                }
                pRVar9 = (((RenderScene *)uVar36)->materials).
                         super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar51 = pRVar9[uVar34].surfaceShader.ior.texture_id;
                if ((long)iVar51 < 0) {
                  local_3f8 = (_Base_ptr)
                              (double)pRVar9[uVar34].surfaceShader.clearcoatRoughness.value;
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Ni ",3);
                  poVar16 = ::std::ostream::_M_insert<double>((double)local_3f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                }
                else {
                  pUVar10 = (((RenderScene *)uVar36)->textures).
                            super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_42c = (undefined1  [4])iVar51;
                  if ((int)((ulong)((long)(((RenderScene *)uVar36)->textures).
                                          super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar10
                                   ) >> 3) * 0x2fa0be83 <= iVar51) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x187;
                    goto LAB_0031749b;
                  }
                  local_400 = (undefined1  [8])pUVar10[iVar51].texture_image_id;
                  if (((long)local_400 < 0) ||
                     (pTVar11 = (((RenderScene *)uVar36)->images).
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                     lVar37 = (long)(((RenderScene *)uVar36)->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11 >> 4,
                     SBORROW8((long)local_400,lVar37 * -0x3333333333333333) ==
                     (long)((long)local_400 + lVar37 * 0x3333333333333333) < 0)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x18c;
                    goto LAB_00316f7e;
                  }
                  local_468._0_8_ = local_468 + 0x10;
                  _Var7._M_p = pTVar11[(long)local_400].asset_identifier._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_468,_Var7._M_p,
                             _Var7._M_p + pTVar11[(long)local_400].asset_identifier._M_string_length
                            );
                  uVar15 = local_468._8_8_;
                  if (local_468._8_8_ == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    poVar16 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)&local_370,0x191);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_42c + 4),"Filename for image id {} is empty.","");
                    fmt::format<long>(&local_490,(string *)(local_42c + 4),(long *)local_400);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_370,local_490._M_dataplus._M_p,
                                         local_490._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p,
                                      local_428.field_2._M_allocated_capacity + 1);
                    }
                    if (local_470 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar24 = (long *)::std::__cxx11::string::append(local_42c + 4);
                      psVar1 = (size_type *)(plVar24 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar24 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490.field_2._8_8_ = plVar24[3];
                        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                      }
                      else {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490._M_dataplus._M_p = (pointer)*plVar24;
                      }
                      local_490._M_string_length = plVar24[1];
                      *plVar24 = (long)psVar1;
                      plVar24[1] = 0;
                      *(undefined1 *)(plVar24 + 2) = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_490._M_dataplus._M_p != &local_490.field_2) {
                        operator_delete(local_490._M_dataplus._M_p,
                                        local_490.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p,
                                        local_428.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
                    ::std::ios_base::~ios_base(local_300);
                  }
                  else {
                    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Ni ",7);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                  }
                  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                  }
                  uVar36 = local_3e8;
                  if (uVar15 == 0) goto LAB_00317636;
                }
                pRVar9 = (((RenderScene *)uVar36)->materials).
                         super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar51 = pRVar9[uVar34].surfaceShader.occlusion.texture_id;
                if ((long)iVar51 < 0) {
                  local_3f8 = (_Base_ptr)(double)pRVar9[uVar34].surfaceShader.occlusion.value;
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Ka ",3);
                  poVar16 = ::std::ostream::_M_insert<double>((double)local_3f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                }
                else {
                  pUVar10 = (((RenderScene *)uVar36)->textures).
                            super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_42c = (undefined1  [4])iVar51;
                  if ((int)((ulong)((long)(((RenderScene *)uVar36)->textures).
                                          super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar10
                                   ) >> 3) * 0x2fa0be83 <= iVar51) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x19d;
                    goto LAB_0031749b;
                  }
                  local_400 = (undefined1  [8])pUVar10[iVar51].texture_image_id;
                  if (((long)local_400 < 0) ||
                     (pTVar11 = (((RenderScene *)uVar36)->images).
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                     lVar37 = (long)(((RenderScene *)uVar36)->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11 >> 4,
                     SBORROW8((long)local_400,lVar37 * -0x3333333333333333) ==
                     (long)((long)local_400 + lVar37 * 0x3333333333333333) < 0)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x1a2;
                    goto LAB_00316f7e;
                  }
                  local_468._0_8_ = local_468 + 0x10;
                  _Var7._M_p = pTVar11[(long)local_400].asset_identifier._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_468,_Var7._M_p,
                             _Var7._M_p + pTVar11[(long)local_400].asset_identifier._M_string_length
                            );
                  uVar15 = local_468._8_8_;
                  if (local_468._8_8_ == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    poVar16 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)&local_370,0x1a7);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_42c + 4),"Filename for image id {} is empty.","");
                    fmt::format<long>(&local_490,(string *)(local_42c + 4),(long *)local_400);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_370,local_490._M_dataplus._M_p,
                                         local_490._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p,
                                      local_428.field_2._M_allocated_capacity + 1);
                    }
                    if (local_470 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar24 = (long *)::std::__cxx11::string::append(local_42c + 4);
                      psVar1 = (size_type *)(plVar24 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar24 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490.field_2._8_8_ = plVar24[3];
                        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                      }
                      else {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490._M_dataplus._M_p = (pointer)*plVar24;
                      }
                      local_490._M_string_length = plVar24[1];
                      *plVar24 = (long)psVar1;
                      plVar24[1] = 0;
                      *(undefined1 *)(plVar24 + 2) = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_490._M_dataplus._M_p != &local_490.field_2) {
                        operator_delete(local_490._M_dataplus._M_p,
                                        local_490.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p,
                                        local_428.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
                    ::std::ios_base::~ios_base(local_300);
                  }
                  else {
                    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Ka ",7);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                  }
                  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                  }
                  uVar36 = local_3e8;
                  if (uVar15 == 0) goto LAB_00317636;
                }
                pRVar9 = (((RenderScene *)uVar36)->materials).
                         super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar51 = pRVar9[uVar34].surfaceShader.ior.texture_id;
                if ((long)iVar51 < 0) {
                  local_3f8 = (_Base_ptr)
                              (double)pRVar9[uVar34].surfaceShader.clearcoatRoughness.value;
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Ni ",3);
                  poVar16 = ::std::ostream::_M_insert<double>((double)local_3f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                }
                else {
                  pUVar10 = (((RenderScene *)uVar36)->textures).
                            super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_42c = (undefined1  [4])iVar51;
                  if ((int)((ulong)((long)(((RenderScene *)uVar36)->textures).
                                          super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar10
                                   ) >> 3) * 0x2fa0be83 <= iVar51) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x1b3;
                    goto LAB_0031749b;
                  }
                  local_400 = (undefined1  [8])pUVar10[iVar51].texture_image_id;
                  if (((long)local_400 < 0) ||
                     (pTVar11 = (((RenderScene *)uVar36)->images).
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                     lVar37 = (long)(((RenderScene *)uVar36)->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11 >> 4,
                     SBORROW8((long)local_400,lVar37 * -0x3333333333333333) ==
                     (long)((long)local_400 + lVar37 * 0x3333333333333333) < 0)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    iVar51 = 0x1b8;
                    goto LAB_00316f7e;
                  }
                  local_468._0_8_ = local_468 + 0x10;
                  _Var7._M_p = pTVar11[(long)local_400].asset_identifier._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_468,_Var7._M_p,
                             _Var7._M_p + pTVar11[(long)local_400].asset_identifier._M_string_length
                            );
                  uVar15 = local_468._8_8_;
                  if (local_468._8_8_ == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_370,"():",3);
                    poVar16 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)&local_370,0x1bd);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_42c + 4),"Filename for image id {} is empty.","");
                    fmt::format<long>(&local_490,(string *)(local_42c + 4),(long *)local_400);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_370,local_490._M_dataplus._M_p,
                                         local_490._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p,
                                      local_428.field_2._M_allocated_capacity + 1);
                    }
                    if (local_470 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar24 = (long *)::std::__cxx11::string::append(local_42c + 4);
                      psVar1 = (size_type *)(plVar24 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar24 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490.field_2._8_8_ = plVar24[3];
                        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                      }
                      else {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490._M_dataplus._M_p = (pointer)*plVar24;
                      }
                      local_490._M_string_length = plVar24[1];
                      *plVar24 = (long)psVar1;
                      plVar24[1] = 0;
                      *(undefined1 *)(plVar24 + 2) = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_490._M_dataplus._M_p != &local_490.field_2) {
                        operator_delete(local_490._M_dataplus._M_p,
                                        local_490.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p,
                                        local_428.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
                    ::std::ios_base::~ios_base(local_300);
                  }
                  else {
                    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Ni ",7);
                    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                  }
                  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                  }
                  uVar36 = local_3e8;
                  if (uVar15 == 0) goto LAB_00317636;
                }
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
                goto LAB_003167c3;
              }
              iVar51 = pRVar9[uVar34].surfaceShader.metallic.texture_id;
              poVar16 = local_1a8;
              if ((long)iVar51 < 0) {
                local_3f8 = (_Base_ptr)
                            CONCAT44(local_3f8._4_4_,pRVar9[uVar34].surfaceShader.metallic.value);
                lVar37 = 3;
                pcVar38 = "Pm ";
                goto LAB_003147ed;
              }
              pUVar10 = (((vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                           *)(local_3e8 + 0x140))->
                        super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              local_42c = (undefined1  [4])iVar51;
              if (iVar51 < (int)((ulong)((long)*(pointer *)(local_3e8 + 0x148) - (long)pUVar10) >> 3
                                ) * 0x2fa0be83) {
                local_400 = (undefined1  [8])pUVar10[iVar51].texture_image_id;
                if (((long)local_400 < 0) ||
                   (pTVar11 = (((vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                 *)(local_3e8 + 0xe0))->
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              )._M_impl.super__Vector_impl_data._M_start,
                   lVar37 = (long)*(pointer *)(local_3e8 + 0xe8) - (long)pTVar11 >> 4,
                   SBORROW8((long)local_400,lVar37 * -0x3333333333333333) ==
                   (long)((long)local_400 + lVar37 * 0x3333333333333333) < 0)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_370,"():",3);
                  iVar51 = 0x10b;
                  goto LAB_00316f7e;
                }
                local_468._0_8_ = local_468 + 0x10;
                _Var7._M_p = pTVar11[(long)local_400].asset_identifier._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_468,_Var7._M_p,
                           _Var7._M_p + pTVar11[(long)local_400].asset_identifier._M_string_length);
                uVar26 = local_468._8_8_;
                if (local_468._8_8_ != 0) {
                  pcVar38 = "map_Pm ";
                  goto LAB_00314708;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_370,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_370,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_370,"export_to_obj",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"():",3);
                iVar51 = 0x110;
LAB_00314905:
                poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_370,iVar51);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)(local_42c + 4),"Filename for image id {} is empty.","");
                fmt::format<long>(&local_490,(string *)(local_42c + 4),(long *)local_400);
                poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_370,local_490._M_dataplus._M_p,
                                     local_490._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_490._M_dataplus._M_p != &local_490.field_2) {
                  operator_delete(local_490._M_dataplus._M_p,
                                  local_490.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_428._M_dataplus._M_p != &local_428.field_2) {
                  operator_delete(local_428._M_dataplus._M_p,
                                  local_428.field_2._M_allocated_capacity + 1);
                }
                if (local_470 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar24 = (long *)::std::__cxx11::string::append(local_42c + 4);
                  psVar1 = (size_type *)(plVar24 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar24 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_490.field_2._M_allocated_capacity = *psVar1;
                    local_490.field_2._8_8_ = plVar24[3];
                    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                  }
                  else {
                    local_490.field_2._M_allocated_capacity = *psVar1;
                    local_490._M_dataplus._M_p = (pointer)*plVar24;
                  }
                  local_490._M_string_length = plVar24[1];
                  *plVar24 = (long)psVar1;
                  plVar24[1] = 0;
                  *(undefined1 *)(plVar24 + 2) = 0;
                  ::std::__cxx11::string::_M_append
                            ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_428._M_dataplus._M_p != &local_428.field_2) {
                    operator_delete(local_428._M_dataplus._M_p,
                                    local_428.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
                ::std::ios_base::~ios_base(local_300);
LAB_00314a95:
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                if (uVar26 == 0) goto LAB_00317636;
                goto LAB_00314aba;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_370,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_370,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_370,"export_to_obj",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"():",3);
              poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_370,0x106);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              paVar4 = &local_490.field_2;
              local_490._M_dataplus._M_p = (pointer)paVar4;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_490,"Invalid texture id {}. scene.textures.size = {}","");
              local_428._M_dataplus._M_p =
                   (pointer)(((long)*(pointer *)(uVar36 + 0x148) -
                              (long)(((vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                       *)(uVar36 + 0x140))->
                                    super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x7d05f417d05f417d);
              fmt::format<int,unsigned_long>
                        ((string *)local_468,(fmt *)&local_490,(string *)local_42c,
                         (int *)(local_42c + 4),(unsigned_long *)warn);
              poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_370,(char *)local_468._0_8_,local_468._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
              if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
              }
              psVar40 = local_470;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_490._M_dataplus._M_p != paVar4) {
                operator_delete(local_490._M_dataplus._M_p,
                                local_490.field_2._M_allocated_capacity + 1);
              }
              if (psVar40 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar24 = (long *)::std::__cxx11::string::append((char *)&local_490);
                local_468._0_8_ = local_468 + 0x10;
                pp_Var32 = (__node_base_ptr *)(plVar24 + 2);
                if ((__node_base_ptr *)*plVar24 == pp_Var32) {
                  local_468._16_8_ = *pp_Var32;
                  local_468._24_8_ = plVar24[3];
                }
                else {
                  local_468._16_8_ = *pp_Var32;
                  local_468._0_8_ = (__node_base_ptr *)*plVar24;
                }
                local_468._8_8_ = plVar24[1];
                *plVar24 = (long)pp_Var32;
                plVar24[1] = 0;
                *(undefined1 *)(plVar24 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)psVar40,local_468._0_8_);
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_490._M_dataplus._M_p == paVar4) goto LAB_00317615;
                goto LAB_00317608;
              }
LAB_00317615:
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
              ::std::ios_base::~ios_base(local_300);
            }
            else {
              pUVar10 = (((RenderScene *)uVar36)->textures).
                        super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_42c = (undefined1  [4])iVar51;
              if ((int)((ulong)((long)(((RenderScene *)uVar36)->textures).
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar10) >>
                       3) * 0x2fa0be83 <= iVar51) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_370,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_370,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_370,"export_to_obj",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"():",3);
                iVar51 = 0xda;
LAB_0031749b:
                poVar16 = (ostream *)::std::ostream::operator<<(&local_370,iVar51);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_490,"Invalid texture id {}. scene.textures.size = {}",""
                          );
                local_428._M_dataplus._M_p =
                     (pointer)(((long)(((RenderScene *)uVar36)->textures).
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(((RenderScene *)uVar36)->textures).
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x7d05f417d05f417d);
                fmt::format<int,unsigned_long>
                          ((string *)local_468,(fmt *)&local_490,(string *)local_42c,
                           (int *)(local_42c + 4),(unsigned_long *)warn);
LAB_00317514:
                poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_370,(char *)local_468._0_8_,local_468._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                pp_Var32 = (__node_base_ptr *)(local_468 + 0x10);
                if ((__node_base_ptr *)local_468._0_8_ != pp_Var32) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                psVar40 = local_470;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_490._M_dataplus._M_p != &local_490.field_2) {
                  operator_delete(local_490._M_dataplus._M_p,
                                  local_490.field_2._M_allocated_capacity + 1);
                }
                if (psVar40 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar24 = (long *)::std::__cxx11::string::append((char *)&local_490);
                  pp_Var31 = (__node_base_ptr *)(plVar24 + 2);
                  if ((__node_base_ptr *)*plVar24 == pp_Var31) {
                    local_468._16_8_ = *pp_Var31;
                    local_468._24_8_ = plVar24[3];
                    local_468._0_8_ = pp_Var32;
                  }
                  else {
                    local_468._16_8_ = *pp_Var31;
                    local_468._0_8_ = (__node_base_ptr *)*plVar24;
                  }
                  local_468._8_8_ = plVar24[1];
                  *plVar24 = (long)pp_Var31;
                  plVar24[1] = 0;
                  *(undefined1 *)(plVar24 + 2) = 0;
                  ::std::__cxx11::string::_M_append((char *)psVar40,local_468._0_8_);
                  if ((__node_base_ptr *)local_468._0_8_ != pp_Var32) {
                    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
LAB_00317608:
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                }
                goto LAB_00317615;
              }
              local_400 = (undefined1  [8])pUVar10[iVar51].texture_image_id;
              if (((long)local_400 < 0) ||
                 (pTVar11 = (((RenderScene *)uVar36)->images).
                            super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 lVar37 = (long)(((RenderScene *)uVar36)->images).
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11 >> 4,
                 SBORROW8((long)local_400,lVar37 * -0x3333333333333333) ==
                 (long)((long)local_400 + lVar37 * 0x3333333333333333) < 0)) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_370,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_370,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_370,"export_to_obj",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"():",3);
                iVar51 = 0xdf;
LAB_00316f7e:
                poVar16 = (ostream *)::std::ostream::operator<<(&local_370,iVar51);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_490,"Invalid image id {}. scene.images.size = {}","");
                local_428._M_dataplus._M_p =
                     (pointer)(((long)(((RenderScene *)uVar36)->images).
                                      super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(((RenderScene *)uVar36)->images).
                                      super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4) *
                              -0x3333333333333333);
                fmt::format<long,unsigned_long>
                          ((string *)local_468,(fmt *)&local_490,(string *)local_400,
                           (long *)(local_42c + 4),(unsigned_long *)warn);
                goto LAB_00317514;
              }
              local_468._0_8_ = local_468 + 0x10;
              _Var7._M_p = pTVar11[(long)local_400].asset_identifier._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_468,_Var7._M_p,
                         _Var7._M_p + pTVar11[(long)local_400].asset_identifier._M_string_length);
              uVar36 = local_468._8_8_;
              if (local_468._8_8_ == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_370,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_370,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_370,"export_to_obj",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"():",3);
                poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_370,0xe4);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)(local_42c + 4),"Filename for image id {} is empty.","");
                fmt::format<long>(&local_490,(string *)(local_42c + 4),(long *)local_400);
                poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_370,local_490._M_dataplus._M_p,
                                     local_490._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_490._M_dataplus._M_p != &local_490.field_2) {
                  operator_delete(local_490._M_dataplus._M_p,
                                  local_490.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_428._M_dataplus._M_p != &local_428.field_2) {
                  operator_delete(local_428._M_dataplus._M_p,
                                  local_428.field_2._M_allocated_capacity + 1);
                }
                if (local_470 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar24 = (long *)::std::__cxx11::string::append(local_42c + 4);
                  psVar1 = (size_type *)(plVar24 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar24 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_490.field_2._M_allocated_capacity = *psVar1;
                    local_490.field_2._8_8_ = plVar24[3];
                    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                  }
                  else {
                    local_490.field_2._M_allocated_capacity = *psVar1;
                    local_490._M_dataplus._M_p = (pointer)*plVar24;
                  }
                  local_490._M_string_length = plVar24[1];
                  *plVar24 = (long)psVar1;
                  plVar24[1] = 0;
                  *(undefined1 *)(plVar24 + 2) = 0;
                  ::std::__cxx11::string::_M_append
                            ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_428._M_dataplus._M_p != &local_428.field_2) {
                    operator_delete(local_428._M_dataplus._M_p,
                                    local_428.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
                ::std::ios_base::~ios_base(local_300);
              }
              else {
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Kd ",7);
                poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
              }
              if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
              }
              if (uVar36 != 0) goto LAB_00314534;
            }
LAB_00317636:
            bVar48 = false;
            goto LAB_00317638;
          }
LAB_003167c3:
          p_Var47 = p_Var47->_M_nxt;
        } while (p_Var47 != (_Hash_node_base *)0x0);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"# ",2);
      poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," materials.\n",0xc);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_370);
      if (local_370 !=
          (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           *)(local_368 + 8)) {
        operator_delete(local_370,local_368._8_8_ + 1);
      }
      bVar48 = true;
LAB_00317638:
      if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
LAB_00317655:
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_3b0);
      goto LAB_00313289;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_370,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
               ,0x5a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"export_to_obj",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"():",3);
    poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_370,0x28);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    pp_Var32 = (__node_base_ptr *)(local_468 + 0x10);
    local_468._0_8_ = pp_Var32;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468,"mesh_id {} is out-of-range. scene.meshes.size {}","");
    local_490._M_dataplus._M_p =
         (pointer)(((long)(scene->meshes).
                          super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(scene->meshes).
                          super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x7063e7063e7063e7);
    fmt::format<int,unsigned_long>
              ((string *)local_3b0,(fmt *)local_468,(string *)local_374,(int *)&local_490,
               (unsigned_long *)warn);
    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_370,(char *)local_3b0._0_8_,local_3b0._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
    pp_Var29 = (__node_base_ptr *)(local_3b0 + 0x10);
    if ((__node_base_ptr *)local_3b0._0_8_ != pp_Var29) {
      operator_delete((void *)local_3b0._0_8_,(ulong)(local_3b0._16_8_ + 1));
    }
    psVar40 = local_470;
    if ((__node_base_ptr *)local_468._0_8_ != pp_Var32) {
      operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
    }
    if (psVar40 != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      plVar24 = (long *)::std::__cxx11::string::append(local_468);
      pp_Var28 = (__node_base_ptr *)(plVar24 + 2);
      if ((__node_base_ptr *)*plVar24 == pp_Var28) {
        local_3b0._16_8_ = *pp_Var28;
        local_3b0._24_8_ = plVar24[3];
        local_3b0._0_8_ = pp_Var29;
      }
      else {
        local_3b0._16_8_ = *pp_Var28;
        local_3b0._0_8_ = (__node_base_ptr *)*plVar24;
      }
      local_3b0._8_8_ = plVar24[1];
      *plVar24 = (long)pp_Var28;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)psVar40,local_3b0._0_8_);
      if ((__node_base_ptr *)local_3b0._0_8_ != pp_Var29) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3b0._16_8_ + 1));
      }
      if ((__node_base_ptr *)local_468._0_8_ != pp_Var32) goto LAB_00313259;
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
  ::std::ios_base::~ios_base(local_300);
  bVar48 = false;
LAB_00313289:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar48;
}

Assistant:

bool export_to_obj(const RenderScene &scene, const int mesh_id,
  std::string &obj_str, std::string &mtl_str, std::string *warn, std::string *err) {

  //
  // NOTE:
  //
  // - Export GeomSubset(per-face material) as group(g) + usemtl
  // - Export skin weight as tinyobjloader's 'vw' extension
  //

  (void)obj_str;
  (void)mtl_str;
  (void)warn;

  std::stringstream ss;

  if (mesh_id < 0) {
    PUSH_ERROR_AND_RETURN("Invalid mesh_id");
  } else if (size_t(mesh_id) >= scene.meshes.size()) {
    PUSH_ERROR_AND_RETURN(fmt::format("mesh_id {} is out-of-range. scene.meshes.size {}", mesh_id, scene.meshes.size()));
  }

  const RenderMesh &mesh = scene.meshes[size_t(mesh_id)];

  ss << "# exported from TinyUSDZ Tydra.\n";
  ss << "mtllib " << mesh_id << mesh.prim_name + ".mtl";
  ss << "\n";
  
  for (size_t i = 0; i < mesh.points.size(); i++) {
    ss << "v " << mesh.points[i][0] << " " << mesh.points[i][1] << " " << mesh.points[i][2] << "\n";
  } 
  ss << "# " << mesh.points.size() << " vertices\n";

  if (mesh.joint_and_weights.jointWeights.size() == (mesh.points.size() * size_t(mesh.joint_and_weights.elementSize))) {
     
    size_t elementSize = size_t(mesh.joint_and_weights.elementSize); // # of weights per vertex.
    for (size_t i = 0; i < mesh.points.size(); i++) {
      ss << "vw ";
      for (size_t w = 0; w < elementSize; w++) {
        if (w > 0) {
          ss << " ";
        }
        ss << mesh.joint_and_weights.jointIndices[i * elementSize + w] << " " << mesh.joint_and_weights.jointWeights[i * elementSize + w];
      } 
      ss << "\n";
    }
  }

  bool has_texcoord = false;
  bool is_facevarying_texcoord = false;
  bool has_normal = false;
  bool is_facevarying_normal = false;

  // primary texcoord only
  if (mesh.texcoords.count(0)) {
    const VertexAttribute &texcoord = mesh.texcoords.at(0);  
    if (texcoord.variability == VertexVariability::FaceVarying) {
      is_facevarying_texcoord = true;
    } else if (texcoord.variability == VertexVariability::Vertex) {
      is_facevarying_texcoord = false;
    } else {
      PUSH_ERROR_AND_RETURN("Vertex variability must be either 'vertex' or 'facevarying' for texcoord0");
    }
    if (texcoord.format == VertexAttributeFormat::Vec2) {
      const float *ptr = reinterpret_cast<const float *>(texcoord.buffer());
      for (size_t i = 0; i < texcoord.vertex_count(); i++) {
        ss << "vt " << ptr[2 * i + 0] << " " << ptr[2 * i + 1] << "\n";
      } 

      has_texcoord = true;
    }
  }

  if (!mesh.normals.empty()) {
    if (mesh.normals.variability == VertexVariability::FaceVarying) {
      is_facevarying_normal = true;
    } else if (mesh.normals.variability == VertexVariability::Vertex) {
      is_facevarying_normal = false;
    } else {
      PUSH_ERROR_AND_RETURN("Vertex variability must be either 'vertex' or 'facevarying' for texcoord0");
    }
    if (mesh.normals.format == VertexAttributeFormat::Vec3) {
      const float *ptr = reinterpret_cast<const float *>(mesh.normals.buffer());
      for (size_t i = 0; i < mesh.normals.vertex_count(); i++) {
        ss << "vn " << ptr[3 * i + 0] << " " << ptr[3 * i + 1] << " " << ptr[3 * i + 2] << "\n";
      } 
      has_normal = true;
    }
  }

  // name -> (mat_id, face_ids)
  std::unordered_map<std::string, std::pair<int, std::vector<uint32_t>>> face_groups;
  if (mesh.material_subsetMap.size()) {

    std::unordered_set<uint32_t> subset_face_ids;

    for (const auto &subset : mesh.material_subsetMap) {
      std::vector<uint32_t> face_ids(subset.second.indices().size());
      for (size_t i = 0; i < subset.second.indices().size(); i++) {
        face_ids[i] = uint32_t(subset.second.indices()[i]); 
        subset_face_ids.insert(face_ids[i]);
      }
      if (subset.first.empty()) {
        PUSH_ERROR_AND_RETURN("Empty material_subset name is not allowed.");
      }
      face_groups[subset.first] = std::make_pair(subset.second.material_id, face_ids);
    }

    // face_ids without materialsubset
    std::vector<uint32_t> face_ids;
    for (size_t i = 0; i < mesh.faceVertexCounts().size(); i++) {
      if (!subset_face_ids.count(uint32_t(i))) {
        face_ids.push_back(uint32_t(i));
      }
    }
    face_groups[""] = std::make_pair(mesh.material_id, face_ids);
  } else {
    std::vector<uint32_t> face_ids(mesh.faceVertexCounts().size());
    std::iota(face_ids.begin(), face_ids.end(), 0);

    face_groups[""] = std::make_pair(mesh.material_id, face_ids);
  }

  // build face_id -> location in mesh.faceVertexIndices table.
  std::vector<size_t> offsets(mesh.faceVertexCounts().size());
  size_t offset = 0;
  for (size_t i = 0; i < mesh.faceVertexCounts().size(); i++) {
    offsets[i] = offset;
    offset += mesh.faceVertexCounts()[i];
  }

  size_t faceIndexOffset = 0;
  // Assume empty group name is iterated first.
  for (const auto &group : face_groups) {

    if (group.first.size()) {
      ss << "g " << group.first << "\n";
    }

    if (std::get<0>(group.second) > -1) {
      uint32_t mat_id = uint32_t(std::get<0>(group.second));
      ss << "usemtl " << scene.materials[mat_id].name << "\n";
    } 

    const auto &face_ids = std::get<1>(group.second);

    for (size_t i = 0; i < face_ids.size(); i++) {
      ss << "f ";

      for (size_t f = 0; f < mesh.faceVertexCounts()[face_ids[i]]; f++) {
        if (f > 0) {
          ss << " ";
        }
        // obj's index starts with 1.
        uint32_t idx = mesh.faceVertexIndices()[offsets[face_ids[i]] + f] + 1;

        uint32_t t_idx = is_facevarying_texcoord ? uint32_t(faceIndexOffset + f) : idx;
        uint32_t n_idx = is_facevarying_normal ? uint32_t(faceIndexOffset + f) : idx;

        if (has_texcoord && has_normal) {
          ss << idx << "/" << t_idx << "/" << n_idx;
        } else if (has_texcoord) {
          ss << idx << "/" << t_idx;
        } else if (has_normal) {
          ss << idx << "//" << n_idx;
        } else {
          ss << idx;
        }
      }

      faceIndexOffset += mesh.faceVertexIndices()[face_ids[i]];
      ss << "\n";
    }

    ss << "\n";
  }

  obj_str = ss.str();

  ss.str("");
  ss << "# exported from TinyUSDZ Tydra.\n";

  // emit material info
  for (const auto &group : face_groups) {
    if (group.second.first == -1) {
      continue;
    }

    uint32_t mat_id = uint32_t(std::get<0>(group.second));
    ss << "newmtl " << scene.materials[mat_id].name << "\n";

    // Original MTL spec: https://paulbourke.net/dataformats/mtl/
    // Emit PBR material: https://github.com/tinyobjloader/tinyobjloader/blob/release/pbr-mtl.md
    
    if (scene.materials[mat_id].surfaceShader.diffuseColor.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.diffuseColor.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Kd " << texname << "\n";
    } else {
      const auto col = scene.materials[mat_id].surfaceShader.diffuseColor.value;
      ss << "Kd " << col[0] << " " << col[1] << " " << col[2] << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.useSpecularWorkflow) {
      if (scene.materials[mat_id].surfaceShader.specularColor.is_texture()) {
        int32_t texId = scene.materials[mat_id].surfaceShader.specularColor.texture_id;
        if ((texId < 0) || (texId >= int(scene.textures.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
        }

        int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
        if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
        }

        std::string texname = scene.images[size_t(imageId)].asset_identifier;
        if (texname.empty()) {
          PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
        }
        ss << "map_Ks " << texname << "\n";
      } else {
        const auto col = scene.materials[mat_id].surfaceShader.specularColor.value;
        ss << "Ks " << col[0] << " " << col[1] << " " << col[2] << "\n";
      }
    } else {

      if (scene.materials[mat_id].surfaceShader.metallic.is_texture()) {
        int32_t texId = scene.materials[mat_id].surfaceShader.metallic.texture_id;
        if ((texId < 0) || (texId >= int(scene.textures.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
        }

        int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
        if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
        }

        std::string texname = scene.images[size_t(imageId)].asset_identifier;
        if (texname.empty()) {
          PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
        }
        ss << "map_Pm " << texname << "\n";
      } else {
        const auto f = scene.materials[mat_id].surfaceShader.metallic.value;
        ss << "Pm " << f << "\n";
      }
    }

    if (scene.materials[mat_id].surfaceShader.roughness.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.roughness.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Pr " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.roughness.value;
      ss << "Pr " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.emissiveColor.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.emissiveColor.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Ke " << texname << "\n";
    } else {
      const auto col = scene.materials[mat_id].surfaceShader.emissiveColor.value;
      ss << "Ke " << col[0] << " " << col[1] << " " << col[2] << "\n";
    }


    if (scene.materials[mat_id].surfaceShader.opacity.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.opacity.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_d " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.opacity.value;
      ss << "d " << f << "\n";
    }

    // emit as cleacoat thickness
    if (scene.materials[mat_id].surfaceShader.clearcoat.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.clearcoat.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Pc " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoat.value;
      ss << "Pc " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.clearcoatRoughness.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.clearcoatRoughness.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Pcr " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoatRoughness.value;
      ss << "Pcr " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.ior.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.ior.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      // map_Ni is not in original mtl definition
      ss << "map_Ni " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoatRoughness.value;
      ss << "Ni " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.occlusion.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.occlusion.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      // Use map_ao?
      ss << "map_Ka " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.occlusion.value;
      ss << "Ka " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.ior.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.ior.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      // map_Ni is not in original mtl definition
      ss << "map_Ni " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoatRoughness.value;
      ss << "Ni " << f << "\n";
    }

    // TODO: opacityThreshold

    ss << "\n";
  }
  ss << "# " << face_groups.size() << " materials.\n";

  mtl_str = ss.str();

  return true;
}